

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_root.c
# Opt level: O2

int arkPrintRootMem(void *arkode_mem,FILE *outfile)

{
  long lVar1;
  int iVar2;
  ulong uVar3;
  
  if (arkode_mem == (void *)0x0) {
    iVar2 = -0x15;
    arkProcessError((ARKodeMem)0x0,-0x15,"ARKode","arkPrintRootMem","arkode_mem = NULL illegal.");
  }
  else {
    if (*(long *)((long)arkode_mem + 0x280) != 0) {
      fprintf((FILE *)outfile,"ark_nrtfn = %i\n",
              (ulong)*(uint *)(*(long *)((long)arkode_mem + 0x280) + 8));
      fprintf((FILE *)outfile,"ark_nge = %li\n",
              *(undefined8 *)(*(long *)((long)arkode_mem + 0x280) + 0x68));
      lVar1 = *(long *)((long)arkode_mem + 0x280);
      if (*(long *)(lVar1 + 0x10) != 0) {
        for (uVar3 = 0; (long)uVar3 < (long)*(int *)(lVar1 + 8); uVar3 = uVar3 + 1) {
          fprintf((FILE *)outfile,"ark_iroots[%i] = %i\n",uVar3 & 0xffffffff,
                  (ulong)*(uint *)(*(long *)(lVar1 + 0x10) + uVar3 * 4));
          lVar1 = *(long *)((long)arkode_mem + 0x280);
        }
      }
      if (*(long *)(lVar1 + 0x18) != 0) {
        for (uVar3 = 0; (long)uVar3 < (long)*(int *)(lVar1 + 8); uVar3 = uVar3 + 1) {
          fprintf((FILE *)outfile,"ark_rootdir[%i] = %i\n",uVar3 & 0xffffffff,
                  (ulong)*(uint *)(*(long *)(lVar1 + 0x18) + uVar3 * 4));
          lVar1 = *(long *)((long)arkode_mem + 0x280);
        }
      }
      fprintf((FILE *)outfile,"ark_taskc = %i\n",(ulong)*(uint *)(lVar1 + 0x60));
      fprintf((FILE *)outfile,"ark_irfnd = %i\n",
              (ulong)*(uint *)(*(long *)((long)arkode_mem + 0x280) + 100));
      fprintf((FILE *)outfile,"ark_mxgnull = %i\n",
              (ulong)*(uint *)(*(long *)((long)arkode_mem + 0x280) + 0x78));
      lVar1 = *(long *)((long)arkode_mem + 0x280);
      if (*(long *)(lVar1 + 0x70) != 0) {
        for (uVar3 = 0; (long)uVar3 < (long)*(int *)(lVar1 + 8); uVar3 = uVar3 + 1) {
          fprintf((FILE *)outfile,"ark_gactive[%i] = %i\n",uVar3 & 0xffffffff,
                  (ulong)*(uint *)(*(long *)(lVar1 + 0x70) + uVar3 * 4));
          lVar1 = *(long *)((long)arkode_mem + 0x280);
        }
      }
      fprintf((FILE *)outfile,"ark_tlo = %.16g\n",*(undefined8 *)(lVar1 + 0x20));
      fprintf((FILE *)outfile,"ark_thi = %.16g\n",
              *(undefined8 *)(*(long *)((long)arkode_mem + 0x280) + 0x28));
      fprintf((FILE *)outfile,"ark_trout = %.16g\n",
              *(undefined8 *)(*(long *)((long)arkode_mem + 0x280) + 0x30));
      lVar1 = *(long *)((long)arkode_mem + 0x280);
      if (*(long *)(lVar1 + 0x38) != 0) {
        for (uVar3 = 0; (long)uVar3 < (long)*(int *)(lVar1 + 8); uVar3 = uVar3 + 1) {
          fprintf((FILE *)outfile,"ark_glo[%i] = %.16g\n",
                  *(undefined8 *)(*(long *)(lVar1 + 0x38) + uVar3 * 8),uVar3 & 0xffffffff);
          lVar1 = *(long *)((long)arkode_mem + 0x280);
        }
      }
      if (*(long *)(lVar1 + 0x40) != 0) {
        for (uVar3 = 0; (long)uVar3 < (long)*(int *)(lVar1 + 8); uVar3 = uVar3 + 1) {
          fprintf((FILE *)outfile,"ark_ghi[%i] = %.16g\n",
                  *(undefined8 *)(*(long *)(lVar1 + 0x40) + uVar3 * 8),uVar3 & 0xffffffff);
          lVar1 = *(long *)((long)arkode_mem + 0x280);
        }
      }
      if (*(long *)(lVar1 + 0x48) != 0) {
        for (uVar3 = 0; (long)uVar3 < (long)*(int *)(lVar1 + 8); uVar3 = uVar3 + 1) {
          fprintf((FILE *)outfile,"ark_grout[%i] = %.16g\n",
                  *(undefined8 *)(*(long *)(lVar1 + 0x48) + uVar3 * 8),uVar3 & 0xffffffff);
          lVar1 = *(long *)((long)arkode_mem + 0x280);
        }
      }
      fprintf((FILE *)outfile,"ark_toutc = %.16g\n",*(undefined8 *)(lVar1 + 0x50));
      fprintf((FILE *)outfile,"ark_ttol = %.16g\n",
              *(undefined8 *)(*(long *)((long)arkode_mem + 0x280) + 0x58));
    }
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

int arkPrintRootMem(void* arkode_mem, FILE *outfile)
{
  int i;
  ARKodeMem ark_mem;
  if (arkode_mem == NULL) {
    arkProcessError(NULL, ARK_MEM_NULL, "ARKode",
                    "arkPrintRootMem", MSG_ARK_NO_MEM);
    return(ARK_MEM_NULL);
  }
  ark_mem = (ARKodeMem) arkode_mem;
  if (ark_mem->root_mem != NULL) {
    fprintf(outfile, "ark_nrtfn = %i\n", ark_mem->root_mem->nrtfn);
    fprintf(outfile, "ark_nge = %li\n", ark_mem->root_mem->nge);
    if (ark_mem->root_mem->iroots != NULL)
      for (i=0; i<ark_mem->root_mem->nrtfn; i++)
        fprintf(outfile, "ark_iroots[%i] = %i\n", i, ark_mem->root_mem->iroots[i]);
    if (ark_mem->root_mem->rootdir != NULL)
      for (i=0; i<ark_mem->root_mem->nrtfn; i++)
        fprintf(outfile, "ark_rootdir[%i] = %i\n", i, ark_mem->root_mem->rootdir[i]);
    fprintf(outfile, "ark_taskc = %i\n", ark_mem->root_mem->taskc);
    fprintf(outfile, "ark_irfnd = %i\n", ark_mem->root_mem->irfnd);
    fprintf(outfile, "ark_mxgnull = %i\n", ark_mem->root_mem->mxgnull);
    if (ark_mem->root_mem->gactive != NULL)
      for (i=0; i<ark_mem->root_mem->nrtfn; i++)
        fprintf(outfile, "ark_gactive[%i] = %i\n", i, ark_mem->root_mem->gactive[i]);
    fprintf(outfile, "ark_tlo = %"RSYM"\n", ark_mem->root_mem->tlo);
    fprintf(outfile, "ark_thi = %"RSYM"\n", ark_mem->root_mem->thi);
    fprintf(outfile, "ark_trout = %"RSYM"\n", ark_mem->root_mem->trout);
    if (ark_mem->root_mem->glo != NULL)
      for (i=0; i<ark_mem->root_mem->nrtfn; i++)
        fprintf(outfile, "ark_glo[%i] = %"RSYM"\n", i, ark_mem->root_mem->glo[i]);
    if (ark_mem->root_mem->ghi != NULL)
      for (i=0; i<ark_mem->root_mem->nrtfn; i++)
        fprintf(outfile, "ark_ghi[%i] = %"RSYM"\n", i, ark_mem->root_mem->ghi[i]);
    if (ark_mem->root_mem->grout != NULL)
      for (i=0; i<ark_mem->root_mem->nrtfn; i++)
        fprintf(outfile, "ark_grout[%i] = %"RSYM"\n", i, ark_mem->root_mem->grout[i]);
    fprintf(outfile, "ark_toutc = %"RSYM"\n", ark_mem->root_mem->toutc);
    fprintf(outfile, "ark_ttol = %"RSYM"\n", ark_mem->root_mem->ttol);
  }
  return(ARK_SUCCESS);
}